

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

Type __thiscall FIX::DataDictionary::XMLTypeToType(DataDictionary *this,string *type)

{
  bool bVar1;
  string *type_local;
  DataDictionary *this_local;
  
  bVar1 = operator<(&(this->m_beginString).super_StringField,"FIX.4.2");
  if ((bVar1) && (bVar1 = std::operator==(type,"CHAR"), bVar1)) {
    this_local._4_4_ = String;
  }
  else {
    bVar1 = std::operator==(type,"STRING");
    if (bVar1) {
      this_local._4_4_ = String;
    }
    else {
      bVar1 = std::operator==(type,"CHAR");
      if (bVar1) {
        this_local._4_4_ = Char;
      }
      else {
        bVar1 = std::operator==(type,"PRICE");
        if (bVar1) {
          this_local._4_4_ = Price;
        }
        else {
          bVar1 = std::operator==(type,"INT");
          if (bVar1) {
            this_local._4_4_ = Int;
          }
          else {
            bVar1 = std::operator==(type,"AMT");
            if (bVar1) {
              this_local._4_4_ = Amt;
            }
            else {
              bVar1 = std::operator==(type,"QTY");
              if (bVar1) {
                this_local._4_4_ = Qty;
              }
              else {
                bVar1 = std::operator==(type,"CURRENCY");
                if (bVar1) {
                  this_local._4_4_ = Currency;
                }
                else {
                  bVar1 = std::operator==(type,"MULTIPLEVALUESTRING");
                  if (bVar1) {
                    this_local._4_4_ = MultipleValueString;
                  }
                  else {
                    bVar1 = std::operator==(type,"MULTIPLESTRINGVALUE");
                    if (bVar1) {
                      this_local._4_4_ = MultipleStringValue;
                    }
                    else {
                      bVar1 = std::operator==(type,"MULTIPLECHARVALUE");
                      if (bVar1) {
                        this_local._4_4_ = MultipleCharValue;
                      }
                      else {
                        bVar1 = std::operator==(type,"EXCHANGE");
                        if (bVar1) {
                          this_local._4_4_ = Exchange;
                        }
                        else {
                          bVar1 = std::operator==(type,"UTCTIMESTAMP");
                          if (bVar1) {
                            this_local._4_4_ = UtcTimeStamp;
                          }
                          else {
                            bVar1 = std::operator==(type,"BOOLEAN");
                            if (bVar1) {
                              this_local._4_4_ = Boolean;
                            }
                            else {
                              bVar1 = std::operator==(type,"LOCALMKTDATE");
                              if (bVar1) {
                                this_local._4_4_ = LocalMktDate;
                              }
                              else {
                                bVar1 = std::operator==(type,"DATA");
                                if (bVar1) {
                                  this_local._4_4_ = Data;
                                }
                                else {
                                  bVar1 = std::operator==(type,"FLOAT");
                                  if (bVar1) {
                                    this_local._4_4_ = Float;
                                  }
                                  else {
                                    bVar1 = std::operator==(type,"PRICEOFFSET");
                                    if (bVar1) {
                                      this_local._4_4_ = PriceOffset;
                                    }
                                    else {
                                      bVar1 = std::operator==(type,"MONTHYEAR");
                                      if (bVar1) {
                                        this_local._4_4_ = MonthYear;
                                      }
                                      else {
                                        bVar1 = std::operator==(type,"DAYOFMONTH");
                                        if (bVar1) {
                                          this_local._4_4_ = DayOfMonth;
                                        }
                                        else {
                                          bVar1 = std::operator==(type,"UTCDATE");
                                          if (bVar1) {
                                            this_local._4_4_ = UtcDate;
                                          }
                                          else {
                                            bVar1 = std::operator==(type,"UTCDATEONLY");
                                            if (bVar1) {
                                              this_local._4_4_ = UtcDate;
                                            }
                                            else {
                                              bVar1 = std::operator==(type,"UTCTIMEONLY");
                                              if (bVar1) {
                                                this_local._4_4_ = UtcTimeOnly;
                                              }
                                              else {
                                                bVar1 = std::operator==(type,"NUMINGROUP");
                                                if (bVar1) {
                                                  this_local._4_4_ = NumInGroup;
                                                }
                                                else {
                                                  bVar1 = std::operator==(type,"PERCENTAGE");
                                                  if (bVar1) {
                                                    this_local._4_4_ = Percentage;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(type,"SEQNUM");
                                                    if (bVar1) {
                                                      this_local._4_4_ = SeqNum;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(type,"LENGTH");
                                                      if (bVar1) {
                                                        this_local._4_4_ = Length;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(type,"COUNTRY");
                                                        if (bVar1) {
                                                          this_local._4_4_ = Country;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(type,"TIME");
                                                          if (bVar1) {
                                                            this_local._4_4_ = UtcTimeStamp;
                                                          }
                                                          else {
                                                            this_local._4_4_ = Unknown;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

TYPE::Type DataDictionary::XMLTypeToType(const std::string &type) const {
  if (m_beginString < "FIX.4.2" && type == "CHAR") {
    return TYPE::String;
  }

  if (type == "STRING") {
    return TYPE::String;
  }
  if (type == "CHAR") {
    return TYPE::Char;
  }
  if (type == "PRICE") {
    return TYPE::Price;
  }
  if (type == "INT") {
    return TYPE::Int;
  }
  if (type == "AMT") {
    return TYPE::Amt;
  }
  if (type == "QTY") {
    return TYPE::Qty;
  }
  if (type == "CURRENCY") {
    return TYPE::Currency;
  }
  if (type == "MULTIPLEVALUESTRING") {
    return TYPE::MultipleValueString;
  }
  if (type == "MULTIPLESTRINGVALUE") {
    return TYPE::MultipleStringValue;
  }
  if (type == "MULTIPLECHARVALUE") {
    return TYPE::MultipleCharValue;
  }
  if (type == "EXCHANGE") {
    return TYPE::Exchange;
  }
  if (type == "UTCTIMESTAMP") {
    return TYPE::UtcTimeStamp;
  }
  if (type == "BOOLEAN") {
    return TYPE::Boolean;
  }
  if (type == "LOCALMKTDATE") {
    return TYPE::LocalMktDate;
  }
  if (type == "DATA") {
    return TYPE::Data;
  }
  if (type == "FLOAT") {
    return TYPE::Float;
  }
  if (type == "PRICEOFFSET") {
    return TYPE::PriceOffset;
  }
  if (type == "MONTHYEAR") {
    return TYPE::MonthYear;
  }
  if (type == "DAYOFMONTH") {
    return TYPE::DayOfMonth;
  }
  if (type == "UTCDATE") {
    return TYPE::UtcDate;
  }
  if (type == "UTCDATEONLY") {
    return TYPE::UtcDateOnly;
  }
  if (type == "UTCTIMEONLY") {
    return TYPE::UtcTimeOnly;
  }
  if (type == "NUMINGROUP") {
    return TYPE::NumInGroup;
  }
  if (type == "PERCENTAGE") {
    return TYPE::Percentage;
  }
  if (type == "SEQNUM") {
    return TYPE::SeqNum;
  }
  if (type == "LENGTH") {
    return TYPE::Length;
  }
  if (type == "COUNTRY") {
    return TYPE::Country;
  }
  if (type == "TIME") {
    return TYPE::UtcTimeStamp;
  }
  return TYPE::Unknown;
}